

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksets_decoder.cpp
# Opt level: O0

uint16_t decode_tile(BitstreamReader *bitstream,TileQueue *tile_queue)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t val;
  uint32_t index;
  TileQueue *tile_queue_local;
  BitstreamReader *bitstream_local;
  
  bVar1 = BitstreamReader::next_bit(bitstream);
  if (bVar1) {
    uVar3 = BitstreamReader::read_bits(bitstream,'\x04');
    TileQueue::move_to_front(tile_queue,uVar3);
  }
  else {
    uVar3 = BitstreamReader::read_bits(bitstream,'\v');
    TileQueue::push_front(tile_queue,(uint16_t)uVar3);
  }
  uVar2 = TileQueue::front(tile_queue);
  return uVar2;
}

Assistant:

static uint16_t decode_tile(BitstreamReader& bitstream, TileQueue& tile_queue)
{
    if(bitstream.next_bit())
    {
        uint32_t index = bitstream.read_bits(4);
        tile_queue.move_to_front(index);
    }
    else
    {
        uint32_t val = bitstream.read_bits(11);
        tile_queue.push_front(val);
    }

    return tile_queue.front();
}